

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O0

void __thiscall
cfgfile::generator::cfg::tag_field_t::on_finish
          (tag_field_t *this,parser_info_t<cfgfile::string_trait_t> *info)

{
  bool bVar1;
  field_type_t fVar2;
  undefined8 uVar3;
  exception_t<cfgfile::string_trait_t> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *__rhs;
  parser_info_t<cfgfile::string_trait_t> *in_RSI;
  tag_t<cfgfile::string_trait_t> *in_RDI;
  parser_info_t<cfgfile::string_trait_t> *in_stack_00000128;
  tag_no_value_t<cfgfile::string_trait_t> *in_stack_00000130;
  string *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  tag_t<cfgfile::string_trait_t> *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe74;
  undefined4 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  long in_stack_fffffffffffffe88;
  allocator local_131;
  string local_130 [288];
  parser_info_t<cfgfile::string_trait_t> *local_10;
  
  local_10 = in_RSI;
  tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(in_RDI);
  fVar2 = field_type_from_string(in_stack_fffffffffffffe38);
  if (((fVar2 == scalar_field_type) ||
      (fVar2 == scalar_vector_field_type || fVar2 == vector_of_tags_field_type)) &&
     (bVar1 = tag_t<cfgfile::string_trait_t>::is_defined(in_stack_fffffffffffffe58), !bVar1)) {
    uVar4 = CONCAT13(1,(int3)in_stack_fffffffffffffe74);
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"Undefined required tag \"",&local_131);
    std::operator+(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    std::operator+(in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40);
    this_00 = (exception_t<cfgfile::string_trait_t> *)
              tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(in_RDI);
    std::operator+(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    std::operator+(in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            parser_info_t<cfgfile::string_trait_t>::line_number(local_10);
    std::__cxx11::to_string(in_stack_fffffffffffffe88);
    std::operator+(in_stack_fffffffffffffe78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uVar4,fVar2));
    std::operator+(__lhs,(char *)in_stack_fffffffffffffe40);
    __rhs = (char *)parser_info_t<cfgfile::string_trait_t>::column_number(local_10);
    std::__cxx11::to_string(in_stack_fffffffffffffe88);
    std::operator+(in_stack_fffffffffffffe78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uVar4,fVar2));
    std::operator+(__lhs,__rhs);
    exception_t<cfgfile::string_trait_t>::exception_t(this_00,__lhs);
    __cxa_throw(uVar3,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  tag_no_value_t<cfgfile::string_trait_t>::on_finish(in_stack_00000130,in_stack_00000128);
  return;
}

Assistant:

void
tag_field_t::on_finish( const parser_info_t< cfgfile::string_trait_t > & info )
{
	switch( field_type_from_string( name() ) )
	{
		case field_t::scalar_field_type :
		case field_t::scalar_vector_field_type :
		case field_t::vector_of_tags_field_type :
		{
			if( !m_value_type.is_defined() )
				throw cfgfile::exception_t< cfgfile::string_trait_t >( std::string( "Undefined required "
						"tag \"" ) + c_value_type_tag_name +
					"\" in tag \"" + name() +
					"\". Line " + std::to_string( info.line_number() ) +
					", column " + std::to_string( info.column_number() ) + "." );
		}
			break;

		default :
			break;
	}

	cfgfile::tag_no_value_t<>::on_finish( info );
}